

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Calls.cpp
# Opt level: O3

RWNode * __thiscall
dg::dda::LLVMReadWriteGraphBuilder::createCallToUndefinedFunction
          (LLVMReadWriteGraphBuilder *this,Function *function,CallInst *CInst)

{
  LLVMDataDependenceAnalysisOptions *pLVar1;
  long lVar2;
  const_iterator cVar3;
  RWNode *pRVar4;
  _Rb_tree_color type;
  undefined1 auVar5 [16];
  RWNode *node;
  key_type local_50;
  RWNode *local_30;
  
  if (((byte)function[0x21] & 0x20) != 0) {
    pRVar4 = createIntrinsicCall(this,CInst);
    return pRVar4;
  }
  if (this->_options[0x98] == (LLVMDataDependenceAnalysisOptions)0x1) {
    auVar5 = llvm::Value::getName();
    if ((auVar5._8_8_ == 0xe) &&
       (*(long *)((long)auVar5._0_8_ + 6) == 0x6574616572635f64 &&
        *auVar5._0_8_ == 0x5f64616572687470)) {
      pRVar4 = createPthreadCreateCalls(this,CInst);
      return pRVar4;
    }
    auVar5 = llvm::Value::getName();
    if ((auVar5._8_8_ == 0xc) &&
       ((int)auVar5._0_8_[1] == 0x6e696f6a && *auVar5._0_8_ == 0x5f64616572687470)) {
      local_50._M_dataplus._M_p = (pointer)CInst;
      local_30 = createUnknownCall(this,CInst);
      std::
      _Rb_tree<llvm::CallInst_const*,std::pair<llvm::CallInst_const*const,dg::dda::RWNode*>,std::_Select1st<std::pair<llvm::CallInst_const*const,dg::dda::RWNode*>>,std::less<llvm::CallInst_const*>,std::allocator<std::pair<llvm::CallInst_const*const,dg::dda::RWNode*>>>
      ::_M_emplace_unique<llvm::CallInst_const*&,dg::dda::RWNode*&>
                ((_Rb_tree<llvm::CallInst_const*,std::pair<llvm::CallInst_const*const,dg::dda::RWNode*>,std::_Select1st<std::pair<llvm::CallInst_const*const,dg::dda::RWNode*>>,std::less<llvm::CallInst_const*>,std::allocator<std::pair<llvm::CallInst_const*const,dg::dda::RWNode*>>>
                  *)&this->threadJoinCalls,(CallInst **)&local_50,&local_30);
      return local_30;
    }
    auVar5 = llvm::Value::getName();
    if ((auVar5._8_8_ == 0xc) &&
       ((int)auVar5._0_8_[1] == 0x74697865 && *auVar5._0_8_ == 0x5f64616572687470)) {
      pRVar4 = createReturn(this,(Instruction *)CInst);
      return pRVar4;
    }
  }
  pLVar1 = this->_options;
  auVar5 = llvm::Value::getName();
  lVar2 = auVar5._0_8_;
  if (lVar2 == 0) {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    local_50._M_string_length = 0;
    local_50.field_2._M_local_buf[0] = '\0';
  }
  else {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,lVar2,auVar5._8_8_ + lVar2);
  }
  cVar3 = std::
          _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>_>
          ::find((_Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>_>
                  *)(pLVar1 + 0x28),&local_50);
  if (cVar3._M_node == (_Base_ptr)(pLVar1 + 0x30)) {
    type = _S_red;
  }
  else {
    type = cVar3._M_node[2]._M_color;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                             local_50.field_2._M_local_buf[0]) + 1);
  }
  if (type == _S_red) {
    pRVar4 = createUnknownCall(this,CInst);
  }
  else if (type == 4) {
    pRVar4 = createRealloc(this,(Instruction *)CInst);
  }
  else {
    pRVar4 = createDynAlloc(this,(Instruction *)CInst,type);
  }
  return pRVar4;
}

Assistant:

RWNode *LLVMReadWriteGraphBuilder::createCallToUndefinedFunction(
        const llvm::Function *function, const llvm::CallInst *CInst) {
    if (function->isIntrinsic()) {
        return createIntrinsicCall(CInst);
    }
    if (_options.threads) {
        // assert(false && "Threads unsupported yet");
        if (function->getName() == "pthread_create") {
            return createPthreadCreateCalls(CInst);
        } else if (function->getName() == "pthread_join") {
            return createPthreadJoinCall(CInst);
        } else if (function->getName() == "pthread_exit") {
            return createPthreadExitCall(CInst);
        }
    }

    auto type = _options.getAllocationFunction(function->getName().str());
    if (type != AllocationFunction::NONE) {
        if (type == AllocationFunction::REALLOC)
            return createRealloc(CInst);
        return createDynAlloc(CInst, type);
    }
    return createUnknownCall(CInst);

    assert(false && "Unreachable");
    abort();
}